

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tclHash.c
# Opt level: O3

void Tcl_DeleteHashEntry(Tcl_HashEntry *entryPtr)

{
  int *piVar1;
  Tcl_HashEntry *pTVar2;
  int iVar3;
  Tcl_HashEntry *pTVar4;
  long lVar5;
  
  pTVar4 = (Tcl_HashEntry *)entryPtr->bucketPtr;
  do {
    pTVar2 = pTVar4->nextPtr;
    if (pTVar2 == entryPtr) {
      pTVar4->nextPtr = entryPtr->nextPtr;
      piVar1 = &entryPtr->tablePtr->numEntries;
      *piVar1 = *piVar1 + -1;
      free(entryPtr);
      return;
    }
    pTVar4 = pTVar2;
  } while (pTVar2 != (Tcl_HashEntry *)0x0);
  Tcl_DeleteHashEntry_cold_1();
  iVar3 = *(int *)&entryPtr[1].nextPtr;
  if (0 < iVar3) {
    lVar5 = 0;
    do {
      pTVar4 = (&entryPtr->nextPtr->nextPtr)[lVar5];
      if (pTVar4 != (Tcl_HashEntry *)0x0) {
        do {
          pTVar2 = pTVar4->nextPtr;
          free(pTVar4);
          pTVar4 = pTVar2;
        } while (pTVar2 != (Tcl_HashEntry *)0x0);
        iVar3 = *(int *)&entryPtr[1].nextPtr;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < iVar3);
  }
  if (entryPtr->nextPtr != (Tcl_HashEntry *)&entryPtr->tablePtr) {
    free(entryPtr->nextPtr);
  }
  entryPtr[1].clientData = BogusFind;
  entryPtr[1].key.oneWordValue = (char *)BogusCreate;
  return;
}

Assistant:

void
Tcl_DeleteHashEntry(Tcl_HashEntry *entryPtr)
{
    register Tcl_HashEntry *prevPtr;

    if (*entryPtr->bucketPtr == entryPtr) {
	*entryPtr->bucketPtr = entryPtr->nextPtr;
    } else {
	for (prevPtr = *entryPtr->bucketPtr;; prevPtr = prevPtr->nextPtr) {
	    if (prevPtr == NULL) {
		tcl_panic("malformed bucket chain in Tcl_DeleteHashEntry");
	    }
	    if (prevPtr->nextPtr == entryPtr) {
		prevPtr->nextPtr = entryPtr->nextPtr;
		break;
	    }
	}
    }
    entryPtr->tablePtr->numEntries--;
    free((char *) entryPtr);
}